

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

void __thiscall ODDLParser::Reference::Reference(Reference *this,size_t numrefs,Name **names)

{
  Name **ppNVar1;
  size_t i;
  size_t sVar2;
  
  this->m_numRefs = numrefs;
  this->m_referencedName = (Name **)0x0;
  if (numrefs != 0) {
    ppNVar1 = (Name **)operator_new__(-(ulong)(numrefs >> 0x3d != 0) | numrefs * 8);
    this->m_referencedName = ppNVar1;
    for (sVar2 = 0; numrefs != sVar2; sVar2 = sVar2 + 1) {
      this->m_referencedName[sVar2] = names[sVar2];
    }
  }
  return;
}

Assistant:

Reference::Reference( size_t numrefs, Name **names )
: m_numRefs( numrefs )
, m_referencedName( ddl_nullptr ) {
    if ( numrefs > 0 ) {
        m_referencedName = new Name *[ numrefs ];
        for ( size_t i = 0; i < numrefs; i++ ) {
            m_referencedName[ i ] = names[i];
        }
    }
}